

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O1

bool __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::ProcessOrEnqueue
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,S2CellId id,Iterator *iter,bool seek)

{
  S2Region *pSVar1;
  int iVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  const_iterator cVar6;
  S2MinDistance distance;
  S2Cell cell;
  S1ChordAngle local_80;
  undefined1 local_78 [56];
  value_type local_40;
  
  if ((int)CONCAT71(in_register_00000009,seek) != 0) {
    local_78._0_8_ = id.id_ - (~id.id_ & id.id_ - 1);
    cVar6 = gtl::internal_btree::
            btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
            ::lower_bound<S2CellId>
                      ((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                        *)iter->map_,(S2CellId *)local_78);
    (iter->iter_).node = cVar6.node;
    (iter->iter_).position = cVar6.position;
  }
  if ((id.id_ & 1) == 0) {
    pbVar3 = (iter->iter_).node;
    iVar2 = (iter->iter_).position;
    if ((pbVar3 != (iter->end_).node) || (uVar4 = 0, iVar2 != (iter->end_).position)) {
      uVar4 = 0;
      do {
        if (((ulong)pbVar3 & 7) != 0) {
LAB_001bfc1f:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                        ,0x1e1,
                        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if ((id.id_ - 1 | id.id_) < *(ulong *)(pbVar3 + (long)iVar2 * 0x28 + 0x10)) break;
        if (uVar4 == 0xc) {
          S2Cell::S2Cell((S2Cell *)local_78,id);
          local_80.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
          iVar2 = (*this->target_->_vptr_S2DistanceTarget[5])(this->target_,(S2Cell *)local_78);
          if (((char)iVar2 != '\0') &&
             ((pSVar1 = this->options_->region_, pSVar1 == (S2Region *)0x0 ||
              (iVar2 = (*pSVar1->_vptr_S2Region[7])(pSVar1,local_78), (char)iVar2 != '\0')))) {
            if (this->use_conservative_cell_distance_ == true) {
              local_80 = operator-(local_80,(this->options_->max_error_).length2_);
            }
            local_40.distance.super_S1ChordAngle.length2_ =
                 (S1ChordAngle)(S1ChordAngle)local_80.length2_;
            local_40.id.id_ = id.id_;
            std::
            priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
            ::push(&this->queue_,&local_40);
          }
          return true;
        }
        this->tmp_point_data_[uVar4] = (PointData *)(pbVar3 + (long)iVar2 * 0x28 + 0x18);
        if (((iter->iter_).node == (iter->end_).node) &&
           ((iter->iter_).position == (iter->end_).position)) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_index.h"
                     ,0x149,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_78._8_8_,"Check failed: !done() ",0x16);
LAB_001bfc1a:
          abort();
        }
        uVar4 = uVar4 + 1;
        gtl::internal_btree::
        btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
        ::increment(&iter->iter_);
        pbVar3 = (iter->iter_).node;
        iVar2 = (iter->iter_).position;
      } while ((pbVar3 != (iter->end_).node) || (iVar2 != (iter->end_).position));
    }
    if ((int)uVar4 != 0) {
      uVar5 = 0;
      do {
        MaybeAddResult(this,this->tmp_point_data_[uVar5]);
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
  }
  else {
    pbVar3 = (iter->iter_).node;
    iVar2 = (iter->iter_).position;
    if ((pbVar3 != (iter->end_).node) || (iVar2 != (iter->end_).position)) {
      do {
        if (((ulong)pbVar3 & 7) != 0) goto LAB_001bfc1f;
        if (*(uint64 *)(pbVar3 + (long)iVar2 * 0x28 + 0x10) != id.id_) {
          return false;
        }
        MaybeAddResult(this,(PointData *)(pbVar3 + (long)iVar2 * 0x28 + 0x18));
        if (((iter->iter_).node == (iter->end_).node) &&
           ((iter->iter_).position == (iter->end_).position)) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_index.h"
                     ,0x149,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_78._8_8_,"Check failed: !done() ",0x16);
          goto LAB_001bfc1a;
        }
        gtl::internal_btree::
        btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
        ::increment(&iter->iter_);
        pbVar3 = (iter->iter_).node;
        iVar2 = (iter->iter_).position;
      } while ((pbVar3 != (iter->end_).node) || (iVar2 != (iter->end_).position));
    }
  }
  return false;
}

Assistant:

bool S2ClosestPointQueryBase<Distance, Data>::ProcessOrEnqueue(
    S2CellId id, Iterator* iter, bool seek) {
  if (seek) iter->Seek(id.range_min());
  if (id.is_leaf()) {
    // Leaf cells can't be subdivided.
    for (; !iter->done() && iter->id() == id; iter->Next()) {
      MaybeAddResult(&iter->point_data());
    }
    return false;  // No need to seek to next child.
  }
  S2CellId last = id.range_max();
  int num_points = 0;
  for (; !iter->done() && iter->id() <= last; iter->Next()) {
    if (num_points == kMinPointsToEnqueue - 1) {
      // This cell has too many points (including this one), so enqueue it.
      S2Cell cell(id);
      Distance distance = distance_limit_;
      // We check "region_" second because it may be relatively expensive.
      if (target_->UpdateMinDistance(cell, &distance) &&
          (!options().region() || options().region()->MayIntersect(cell))) {
        if (use_conservative_cell_distance_) {
          // Ensure that "distance" is a lower bound on distance to the cell.
          distance = distance - options().max_error();
        }
        queue_.push(QueueEntry(distance, id));
      }
      return true;  // Seek to next child.
    }
    tmp_point_data_[num_points++] = &iter->point_data();
  }
  // There were few enough points that we might as well process them now.
  for (int i = 0; i < num_points; ++i) {
    MaybeAddResult(tmp_point_data_[i]);
  }
  return false;  // No need to seek to next child.
}